

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int float128_unordered_sparc(float128 a,float128 b,float_status *status)

{
  int32_t iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  float_status *status_local;
  float128 b_local;
  float128 a_local;
  
  iVar1 = extractFloat128Exp(a);
  if (iVar1 == 0x7fff) {
    uVar2 = extractFloat128Frac0(a);
    uVar3 = extractFloat128Frac1(a);
    if (uVar2 == 0 && uVar3 == 0) goto LAB_00d99efe;
LAB_00d99f40:
    float_raise_sparc('\x01',status);
    a_local.high._4_4_ = 1;
  }
  else {
LAB_00d99efe:
    iVar1 = extractFloat128Exp(b);
    if (iVar1 == 0x7fff) {
      uVar2 = extractFloat128Frac0(b);
      uVar3 = extractFloat128Frac1(b);
      if (uVar2 != 0 || uVar3 != 0) goto LAB_00d99f40;
    }
    a_local.high._4_4_ = 0;
  }
  return a_local.high._4_4_;
}

Assistant:

int float128_unordered(float128 a, float128 b, float_status *status)
{
    if (    (    ( extractFloat128Exp( a ) == 0x7FFF )
              && ( extractFloat128Frac0( a ) | extractFloat128Frac1( a ) ) )
         || (    ( extractFloat128Exp( b ) == 0x7FFF )
              && ( extractFloat128Frac0( b ) | extractFloat128Frac1( b ) ) )
       ) {
        float_raise(float_flag_invalid, status);
        return 1;
    }
    return 0;
}